

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall
Script_SetStackData_kOpPushData2_error_Test::TestBody
          (Script_SetStackData_kOpPushData2_error_Test *this)

{
  char *in_R9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  AssertHelper local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Script script;
  
  script._vptr_Script._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bytes,2,(value_type_conflict *)&script,(allocator_type *)&local_80);
  *(undefined1 *)
   CONCAT71(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._1_7_,
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_) = 0x4d;
  cfd::core::ByteData::ByteData((ByteData *)&local_80,&bytes);
  cfd::core::Script::Script(&script,(ByteData *)&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  cfd::core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&script,(internal *)&bytes,(AssertionResult *)0x414853,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
             ,0xd6,(char *)CONCAT71(script._vptr_Script._1_7_,script._vptr_Script._0_1_));
  testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  std::__cxx11::string::~string((string *)&script);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData2_error) {
  try {
    std::vector<uint8_t> bytes(2, 0xff);
    bytes[0] = 0x4d;
    Script script(bytes);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "OP_PUSHDATA2 is incorrect size.");
    return;
  }
  ASSERT_TRUE(false);
}